

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

Matrix<double> * __thiscall
nnad::Matrix<double>::operator*
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  int l1;
  int c2;
  double value;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  char *local_58;
  long local_50;
  char local_48 [16];
  double local_38;
  
  local_60 = this->_Lines;
  iVar1 = this->_Columns;
  local_5c = term->_Columns;
  if (iVar1 != term->_Lines) {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Lines or Columns don\'t match multiplying the two matrices.","")
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(-10);
  }
  local_58 = (char *)CONCAT44(local_58._4_4_,0xffffffff);
  Matrix(__return_storage_ptr__,&local_60,&local_5c,(int *)&local_58);
  local_64 = 0;
  if (0 < local_5c) {
    iVar2 = local_5c;
    iVar4 = local_60;
    do {
      local_6c = 0;
      if (0 < iVar4) {
        do {
          local_58 = (char *)0x0;
          local_68 = 0;
          if (0 < iVar1) {
            do {
              local_38 = (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[this->_Columns * local_6c + local_68];
              dVar5 = GetElement(term,&local_68,&local_64);
              local_58 = (char *)(local_38 * dVar5 + (double)local_58);
              local_68 = local_68 + 1;
            } while (local_68 < iVar1);
          }
          SetElement(__return_storage_ptr__,&local_6c,&local_64,(double *)&local_58);
          local_6c = local_6c + 1;
          iVar2 = local_5c;
          iVar4 = local_60;
        } while (local_6c < local_60);
      }
      local_64 = local_64 + 1;
    } while (local_64 < iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> operator * (Matrix<T> const& term) const
    {
      const int l1 = _Lines;
      const int c1 = _Columns;
      const int l2 = term.GetLines();
      const int c2 = term.GetColumns();
      if (c1 != l2)
        Error("Lines or Columns don't match multiplying the two matrices.");

      Matrix result{l1, c2};
      for (int i = 0; i < c2; i++)
        for (int j = 0; j < l1; j++)
          {
            T value = T(0);
            for (int k = 0; k < c1; k++)
              value += _Matrix[j * _Columns + k] * term.GetElement(k, i);

            result.SetElement(j, i, value);
          }

      return result;
    }